

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.h
# Opt level: O0

Pointer __thiscall
snestistics::AnnotationResolver::find_last_free_before_or_at
          (AnnotationResolver *this,Pointer p,Pointer stop)

{
  uint32_t uVar1;
  int *piVar2;
  const_reference pvVar3;
  Annotation *a;
  int ai;
  int i;
  Pointer stop_local;
  Pointer p_local;
  AnnotationResolver *this_local;
  
  a._4_4_ = p;
  do {
    if ((int)a._4_4_ < (int)stop) {
      return stop;
    }
    uVar1 = Array<int>::size(&this->_annotation_for_adress);
    if (a._4_4_ < uVar1) {
      piVar2 = Array<int>::operator[](&this->_annotation_for_adress,(long)(int)a._4_4_);
      if ((*piVar2 != -1) &&
         ((pvVar3 = std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::
                    operator[](&this->_annotations,(long)*piVar2),
          pvVar3->type == ANNOTATION_FUNCTION || (pvVar3->type == ANNOTATION_DATA)))) {
        if (a._4_4_ == p) {
          return 0xffffffff;
        }
        return pvVar3->endOfRange + 1;
      }
    }
    a._4_4_ = a._4_4_ - 1;
  } while( true );
}

Assistant:

Pointer find_last_free_before_or_at(const Pointer p, const Pointer stop) const {
		// TODO: We could binary search annotations for stop instead to avoid linear search

		// Assume in same bank
		for (int i = p; i >= (int32_t)stop; i--) {
			if ((uint32_t)i >= _annotation_for_adress.size())
				continue;
			int ai = _annotation_for_adress[i];
			if (ai == -1)
				continue;
			const Annotation &a = _annotations[ai];
			if (a.type == ANNOTATION_FUNCTION || a.type == ANNOTATION_DATA) {
				if ((uint32_t)i == p)
					return INVALID_POINTER; // No valid
				return a.endOfRange+1;
			}
		}
		return stop;
	}